

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O3

Error * ot::commissioner::security_material::GetDomainSM
                  (Error *__return_storage_ptr__,string *aDid,SecurityMaterials *aSM)

{
  char cVar1;
  ErrorCode EVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  _Alloc_hider _Var5;
  char *pcVar6;
  char *pcVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  long lVar8;
  pointer __rhs;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>
  __l;
  string out;
  string path;
  Error tokenError;
  writer write_1;
  string domPath;
  writer write;
  ByteArray bytes;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  smElements;
  undefined1 local_1f8 [24];
  char local_1e0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  _Alloc_hider _Stack_1a0;
  undefined1 local_198 [24];
  parse_func local_180 [2] [1];
  undefined1 local_170 [16];
  ByteArray *local_160;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  ByteArray *local_138;
  string *local_130;
  pointer local_128;
  writer local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [32];
  ByteArray local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  SecurityMaterials *local_b0;
  string local_a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  local_88;
  string local_70;
  string local_50;
  
  __return_storage_ptr__->mCode = kNone;
  local_130 = (string *)&__return_storage_ptr__->mMessage;
  local_b8 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_b8;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_1a8 = (undefined1  [8])local_198;
  local_128 = (pointer)aDid;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"cert.pem","");
  local_198._16_8_ = &aSM->mCertificate;
  local_180[0][0] = (parse_func)local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"priv.pem","");
  local_160 = &aSM->mPrivateKey;
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"ca.pem","");
  local_138 = &aSM->mTrustAnchor;
  __l._M_len = 3;
  __l._M_array = (iterator)local_1a8;
  local_b0 = aSM;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  ::vector(&local_88,__l,(allocator_type *)local_1f8);
  lVar8 = 0;
  do {
    if (local_148 + lVar8 != *(undefined1 **)((long)local_158 + lVar8)) {
      operator_delete(*(undefined1 **)((long)local_158 + lVar8));
    }
    lVar8 = lVar8 + -0x28;
  } while (lVar8 != -0x78);
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char*>((string *)local_1a8,smRoot,DAT_002e2d80 + smRoot);
  _Var5._M_p = _Stack_1a0._M_p;
  if (local_1a8 != (undefined1  [8])local_198) {
    operator_delete((void *)local_1a8);
  }
  if (_Var5._M_p != (pointer)0x0) {
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char*>((string *)local_1a8,smRoot,DAT_002e2d80 + smRoot);
    pcVar6 = (char *)std::__cxx11::string::append(local_1a8);
    pcVar6 = (char *)std::__cxx11::string::_M_append
                               (pcVar6,(ulong)(local_128->first)._M_dataplus._M_p);
    std::__cxx11::string::append(pcVar6);
    std::__cxx11::string::_M_assign((string *)&local_118);
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_118._M_dataplus._M_p,
               local_118._M_dataplus._M_p + local_118._M_string_length);
    PathExists((Error *)local_1a8,&local_50);
    __return_storage_ptr__->mCode = local_1a8._0_4_;
    std::__cxx11::string::operator=(local_130,(string *)&_Stack_1a0);
    EVar2 = __return_storage_ptr__->mCode;
    if (_Stack_1a0._M_p != local_198 + 8) {
      operator_delete(_Stack_1a0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (EVar2 == kNone) {
      local_128 = local_88.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_88.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __rhs = local_88.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::operator+(&local_1c8,&local_118,&__rhs->first);
          local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
          _Stack_1a0._M_p = local_198 + 8;
          local_198._0_8_ = 0;
          local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,local_1c8._M_dataplus._M_p,
                     local_1c8._M_string_length + local_1c8._M_dataplus._M_p);
          PathExists((Error *)local_1f8,&local_a8);
          uVar4 = local_1a8._0_4_;
          uVar3 = local_1f8._0_4_;
          if ((char *)local_1f8._8_8_ != local_1e0) {
            operator_delete((void *)local_1f8._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p);
          }
          if (_Stack_1a0._M_p != local_198 + 8) {
            operator_delete(_Stack_1a0._M_p);
          }
          if (uVar4 == uVar3) {
            local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            ReadPemFile((Error *)local_1a8,&local_d8,&local_1c8);
            __return_storage_ptr__->mCode = local_1a8._0_4_;
            std::__cxx11::string::operator=(local_130,(string *)&_Stack_1a0);
            if (_Stack_1a0._M_p != local_198 + 8) {
              operator_delete(_Stack_1a0._M_p);
            }
            if (__return_storage_ptr__->mCode == kNone) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (__rhs->second,&local_d8);
            }
            else {
              if (gVerbose == '\x01') {
                local_1a8._0_4_ = 0xd;
                _Stack_1a0._M_p = "Failed to read security data from file {}";
                local_198._0_8_ = 0x29;
                local_198._8_8_ = 0x100000000;
                local_198._16_8_ = local_1a8;
                local_180[0][0] =
                     ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                ;
                pcVar6 = "Failed to read security data from file {}";
                local_f8._0_8_ = local_198._16_8_;
                do {
                  cVar1 = *pcVar6;
                  pcVar7 = pcVar6;
                  while (cVar1 != '{') {
                    pcVar7 = pcVar7 + 1;
                    if (pcVar7 == "") {
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::writer::operator()((writer *)local_f8,pcVar6,"");
                      goto LAB_00202b73;
                    }
                    cVar1 = *pcVar7;
                  }
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()((writer *)local_f8,pcVar6,pcVar7);
                  pcVar6 = ::fmt::v10::detail::
                           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                     (pcVar7,"",(format_string_checker<char> *)local_1a8);
                } while (pcVar6 != "");
LAB_00202b73:
                local_1a8 = (undefined1  [8])local_1c8._M_dataplus._M_p;
                _Stack_1a0._M_p = (pointer)local_1c8._M_string_length;
                fmt.size_ = 0xd;
                fmt.data_ = (char *)0x29;
                args.field_1.args_ = in_R9.args_;
                args.desc_ = (unsigned_long_long)local_1a8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_1f8,(v10 *)"Failed to read security data from file {}",
                           fmt,args);
                Console::Write((string *)local_1f8,kRed);
              }
              else {
                local_1f8._0_8_ = local_1f8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1f8,"security-materials","");
                local_1a8._0_4_ = 0xd;
                _Stack_1a0._M_p = "Failed to read security data from file {}";
                local_198._0_8_ = 0x29;
                local_198._8_8_ = 0x100000000;
                local_198._16_8_ = local_1a8;
                local_180[0][0] =
                     ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
                ;
                pcVar6 = "Failed to read security data from file {}";
                local_120.handler_ = (format_string_checker<char> *)local_198._16_8_;
                do {
                  cVar1 = *pcVar6;
                  pcVar7 = pcVar6;
                  while (cVar1 != '{') {
                    pcVar7 = pcVar7 + 1;
                    if (pcVar7 == "") {
                      ::fmt::v10::detail::
                      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::writer::operator()(&local_120,pcVar6,"");
                      goto LAB_00202bbd;
                    }
                    cVar1 = *pcVar7;
                  }
                  ::fmt::v10::detail::
                  parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::writer::operator()(&local_120,pcVar6,pcVar7);
                  pcVar6 = ::fmt::v10::detail::
                           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                     (pcVar7,"",(format_string_checker<char> *)local_1a8);
                } while (pcVar6 != "");
LAB_00202bbd:
                local_1a8 = (undefined1  [8])local_1c8._M_dataplus._M_p;
                _Stack_1a0._M_p = (pointer)local_1c8._M_string_length;
                fmt_00.size_ = 0xd;
                fmt_00.data_ = (char *)0x29;
                args_00.field_1.args_ = in_R9.args_;
                args_00.desc_ = (unsigned_long_long)local_1a8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_f8,(v10 *)"Failed to read security data from file {}",
                           fmt_00,args_00);
                Log(kError,(string *)local_1f8,(string *)local_f8);
                if ((format_string_checker<char> *)local_f8._0_8_ !=
                    (format_string_checker<char> *)(local_f8 + 0x10)) {
                  operator_delete((void *)local_f8._0_8_);
                }
              }
              if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                operator_delete((void *)local_1f8._0_8_);
              }
            }
            if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_d8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          __rhs = __rhs + 1;
        } while (__rhs != local_128);
      }
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      std::__cxx11::string::append((char *)&local_1c8);
      local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
      _Stack_1a0._M_p = local_198 + 8;
      local_198._0_8_ = 0;
      local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_1c8._M_dataplus._M_p,
                 local_1c8._M_string_length + local_1c8._M_dataplus._M_p);
      PathExists((Error *)local_1f8,&local_70);
      uVar4 = local_1a8._0_4_;
      uVar3 = local_1f8._0_4_;
      if ((char *)local_1f8._8_8_ != local_1e0) {
        operator_delete((void *)local_1f8._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (_Stack_1a0._M_p != local_198 + 8) {
        operator_delete(_Stack_1a0._M_p);
      }
      if (uVar4 == uVar3) {
        local_1f8._0_8_ = (pointer)0x0;
        local_1f8._8_8_ = (char *)0x0;
        local_1f8._16_8_ = (pointer)0x0;
        ReadHexStringFile((Error *)local_1a8,(ByteArray *)local_1f8,&local_1c8);
        if (local_1a8._0_4_ == none_type) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&local_b0->mCommissionerToken,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f8);
        }
        if (_Stack_1a0._M_p != local_198 + 8) {
          operator_delete(_Stack_1a0._M_p);
        }
        if ((pointer)local_1f8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_1f8._0_8_);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
    }
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>_>_>
  ::~vector(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error GetDomainSM(const std::string &aDid, SecurityMaterials &aSM)
{
    Error               error;
    std::string         domPath;
    std::vector<SMPair> smElements{
        {"cert.pem", &aSM.mCertificate}, {"priv.pem", &aSM.mPrivateKey}, {"ca.pem", &aSM.mTrustAnchor}};

    // If SM root is unset, do nothing
    VerifyOrExit(!smRoot.Get().empty());

    domPath = smRoot.Get().append("dom/").append(aDid).append("/");
    SuccessOrExit(error = PathExists(domPath));
    for (const auto &element : smElements)
    {
        std::string path = domPath + element.first;
        if (ERROR_NONE != PathExists(path))
        {
            continue;
        }
        ByteArray bytes;
        error = ReadPemFile(bytes, path);
        if (error != ERROR_NONE)
        {
            if (gVerbose)
            {
                std::string out = fmt::format(FMT_STRING(SM_ERROR_MESSAGE_PEM_READ_FAILED), path);
                Console::Write(out, Console::Color::kRed);
            }
            else
            {
                LOG_ERROR(LOG_REGION_SECURITY_MATERIALS, SM_ERROR_MESSAGE_PEM_READ_FAILED, path);
            }
        }
        else
        {
            *element.second = bytes;
        }
    }

    do
    {
        std::string path = domPath + "tok.cbor";
        if (ERROR_NONE != PathExists(path))
        {
            break;
        }
        ByteArray bytes;
        Error     tokenError = ReadHexStringFile(bytes, path);
        if (ERROR_NONE == tokenError)
        {
            aSM.mCommissionerToken = bytes;
        }
    } while (false);
exit:
    return error;
}